

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O1

vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
* __thiscall
psy::C::SemanticModel::
fieldsFor_CORE<std::vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>>
          (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           *__return_storage_ptr__,SemanticModel *this,FieldDeclarationSyntax *node,
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          *decls)

{
  _Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false> _Var1;
  ulong uVar2;
  long *plVar3;
  SymbolKind SVar4;
  int iVar5;
  long lVar6;
  Symbol *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar8;
  ulong uVar9;
  DeclaratorListSyntax *pDVar10;
  long *plVar11;
  long *plVar12;
  FieldDeclarationSymbol *local_38;
  
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl;
  uVar2 = ((_Var1._M_head_impl)->declsBySyntax_)._M_h._M_bucket_count;
  uVar9 = (ulong)node % uVar2;
  plVar11 = *(long **)(*(long *)&((_Var1._M_head_impl)->declsBySyntax_)._M_h + uVar9 * 8);
  plVar12 = (long *)0x0;
  if ((plVar11 != (long *)0x0) &&
     (plVar3 = (long *)*plVar11, plVar12 = plVar11,
     (FieldDeclarationSyntax *)((long *)*plVar11)[1] != node)) {
    while (plVar11 = plVar3, plVar3 = (long *)*plVar11, plVar3 != (long *)0x0) {
      plVar12 = (long *)0x0;
      if (((ulong)plVar3[1] % uVar2 != uVar9) ||
         (plVar12 = plVar11, (FieldDeclarationSyntax *)plVar3[1] == node)) goto LAB_002f23fb;
    }
    plVar12 = (long *)0x0;
  }
LAB_002f23fb:
  if (plVar12 == (long *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = *plVar12;
  }
  if (lVar6 == 0) {
    pDVar10 = node->decltors_;
    if (pDVar10 != (DeclaratorListSyntax *)0x0) {
      do {
        pSVar7 = &declarationBy(this,(pDVar10->
                                     super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                     ).
                                     super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                     .value)->super_Symbol;
        if (pSVar7 == (Symbol *)0x0) {
          if (((this->impl_)._M_t.
               super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
               .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
              _M_head_impl)->bindingIsOK_ == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                       ,0x5c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x106);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
        }
        else {
          SVar4 = Symbol::kind(pSVar7);
          if (SVar4 != FieldDeclaration) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                       ,0x5c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x109);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          iVar5 = (*pSVar7->_vptr_Symbol[0x14])(pSVar7);
          local_38 = (FieldDeclarationSymbol *)CONCAT44(extraout_var_00,iVar5);
          std::
          vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
          ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
                    ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                      *)decls,&local_38);
        }
        pDVar10 = (pDVar10->
                  super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                  ).
                  super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                  .next;
      } while (pDVar10 != (SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *)0x0);
    }
  }
  else {
    pSVar7 = (Symbol *)(**(code **)(**(long **)(lVar6 + 0x10) + 0x30))();
    SVar4 = Symbol::kind(pSVar7);
    if (SVar4 != FieldDeclaration) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                 ,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      (__return_storage_ptr__->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_start =
           (decls->
           super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (decls->
           super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           (decls->
           super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (decls->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (decls->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (decls->
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    iVar5 = (*pSVar7->_vptr_Symbol[0x14])(pSVar7);
    local_38 = (FieldDeclarationSymbol *)CONCAT44(extraout_var,iVar5);
    std::
    vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
    ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
              ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                *)decls,&local_38);
  }
  (__return_storage_ptr__->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

VecT SemanticModel::fieldsFor_CORE(
        const FieldDeclarationSyntax* node,
        VecT&& decls)
{
    // Anonymous structure/union fields are bound to the field declaration
    // syntax node while regular fields to the declarators syntax nodes.
    auto it = P->declsBySyntax_.find(node);
    if (it != P->declsBySyntax_.end()) {
        auto decl = it->second->asDeclaration();
        PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, return decls);
        decls.push_back(decl->asFieldDeclaration());
    }
    else {
        for (auto decltorIt = node->declarators(); decltorIt; decltorIt = decltorIt->next) {
            auto decl = declarationBy(decltorIt->value);
            if (!decl) {
                PSY_ASSERT_1(!P->bindingIsOK_);
                continue;
            }
            PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, continue);
            decls.push_back(decl->asFieldDeclaration());
        }
    }
    return std::move(decls);
}